

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

EnumValueOptions *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::EnumValueOptions>(Arena *arena)

{
  EnumValueOptions *this;
  
  if (arena == (Arena *)0x0) {
    this = (EnumValueOptions *)operator_new(0x50);
    EnumValueOptions::EnumValueOptions(this);
  }
  else {
    AllocHook(arena,(type_info *)&EnumValueOptions::typeinfo,0x50);
    this = (EnumValueOptions *)internal::ArenaImpl::AllocateAligned(&arena->impl_,0x50);
    EnumValueOptions::EnumValueOptions(this,arena);
  }
  return this;
}

Assistant:

static void InitDefaultsscc_info_SourceCodeInfo_google_2fprotobuf_2fdescriptor_2eproto() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  {
    void* ptr = &PROTOBUF_NAMESPACE_ID::_SourceCodeInfo_default_instance_;
    new (ptr) PROTOBUF_NAMESPACE_ID::SourceCodeInfo();
    ::PROTOBUF_NAMESPACE_ID::internal::OnShutdownDestroyMessage(ptr);
  }
  PROTOBUF_NAMESPACE_ID::SourceCodeInfo::InitAsDefaultInstance();
}